

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O3

void __thiscall CTcSrcFile::~CTcSrcFile(CTcSrcFile *this)

{
  ~CTcSrcFile(this);
  operator_delete(this,0x430);
  return;
}

Assistant:

CTcSrcFile::~CTcSrcFile()
{
    /* close my source file */
    if (fp_ != 0)
        delete fp_;

    /* release my character mapper */
    if (mapper_ != 0)
        mapper_->release_ref();
}